

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O0

void __thiscall
supermap::BloomFilter<supermap::Key<10UL>_>::reserve
          (BloomFilter<supermap::Key<10UL>_> *this,uint64_t numberOfElements)

{
  IllegalStateException *this_00;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar1 [16];
  size_t size;
  bool in_stack_00000037;
  size_type in_stack_00000038;
  vector<bool,_std::allocator<bool>_> *in_stack_00000040;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
    this_00 = (IllegalStateException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    supermap::IllegalStateException::IllegalStateException
              (this_00,(string *)&stack0xffffffffffffffd0);
    __cxa_throw(this_00,&IllegalStateException::typeinfo,
                IllegalStateException::~IllegalStateException);
  }
  *(undefined1 *)(in_RDI + 0x58) = 1;
  auVar1._8_4_ = (int)((ulong)in_RSI >> 0x20);
  auVar1._0_8_ = in_RSI;
  auVar1._12_4_ = 0x45300000;
  ceil(((auVar1._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) * *(double *)(in_RDI + 0x10)
      );
  std::vector<bool,_std::allocator<bool>_>::resize
            (in_stack_00000040,in_stack_00000038,in_stack_00000037);
  return;
}

Assistant:

void reserve(std::uint64_t numberOfElements) override {
        if (wasReserved_) {
            throw supermap::IllegalStateException("Filter size has been already reserved");
        }
        wasReserved_ = true;
        auto size = static_cast<std::size_t>(std::ceil(static_cast<double>(numberOfElements) * sizeMultiplier_));
        elements_.resize(size);
    }